

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

void add_format_to_iofile
               (FMContext fmc,FMFormat_conflict format,int id_size,void *id_buffer,int index)

{
  FMFormat_conflict p_Var1;
  char *pcVar2;
  FMFormat_conflict *pp_Var3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int format_count;
  ulong uVar7;
  char buffer [256];
  char acStack_138 [264];
  
  if (format_server_verbose == -1) {
    pcVar2 = getenv("FORMAT_SERVER_VERBOSE");
    format_server_verbose = (int)(pcVar2 != (char *)0x0);
  }
  if (format_server_verbose != 0) {
    printf("Entering format %s (%p) into context %p ",format->format_name,format);
    stringify_server_ID((uchar *)id_buffer,acStack_138,0x100);
    printf("%s",acStack_138);
  }
  uVar7 = 0;
  pp_Var3 = format->subformats;
  while ((pp_Var3 != (FMFormat_conflict *)0x0 && (pp_Var3[uVar7] != (FMFormat_conflict)0x0))) {
    pp_Var3[uVar7]->subformats = pp_Var3;
    uVar7 = uVar7 + 1;
    pp_Var3 = format->subformats;
  }
  if (id_size != 0) {
    (format->server_ID).length = id_size;
    pcVar2 = (char *)ffs_malloc((long)id_size);
    (format->server_ID).value = pcVar2;
    memcpy(pcVar2,id_buffer,(long)id_size);
  }
  fill_derived_format_values(fmc,format);
  format_count = (int)uVar7;
  if (format_count != 0) {
    uVar5 = 0;
    do {
      fill_derived_format_values(fmc,format->subformats[uVar5]);
      uVar5 = uVar5 + 1;
    } while ((uVar7 & 0xffffffff) != uVar5);
  }
  if (fmc->reg_format_count == fmc->format_list_size) {
    expand_FMContext(fmc);
  }
  if (index == -1) {
    index = fmc->reg_format_count;
    fmc->reg_format_count = index + 1;
    lVar6 = (long)index;
  }
  else {
    lVar6 = (long)index;
    if (fmc->format_list[lVar6] != (FMFormat_conflict)0x0) {
      free_FMformat(fmc->format_list[lVar6]);
    }
    if (fmc->reg_format_count < index) {
      printf("Internal error. skipped format ids format %s.\n",format->format_name);
      return;
    }
    if (fmc->reg_format_count == index) {
      fmc->reg_format_count = index + 1;
    }
  }
  fmc->format_list[lVar6] = format;
  format->format_index = index;
  topo_order_subformats(format,format_count);
  if (format_count != 0) {
    pp_Var3 = format->subformats;
    iVar4 = 0;
    do {
      uVar5 = 0;
      do {
        p_Var1 = pp_Var3[uVar5];
        if (0 < (long)p_Var1->field_count) {
          lVar6 = 0;
          do {
            if (p_Var1->field_subformats[lVar6] != (FMFormat_conflict)0x0) {
              p_Var1->variant = p_Var1->variant | p_Var1->field_subformats[lVar6]->variant;
            }
            lVar6 = lVar6 + 1;
          } while (p_Var1->field_count != lVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uVar7 & 0xffffffff));
      iVar4 = iVar4 + 1;
    } while (iVar4 != format_count);
  }
  if (0 < (long)format->field_count) {
    lVar6 = 0;
    do {
      if (format->field_subformats[lVar6] != (FMFormat_conflict)0x0) {
        format->variant = format->variant | format->field_subformats[lVar6]->variant;
      }
      lVar6 = lVar6 + 1;
    } while (format->field_count != lVar6);
  }
  return;
}

Assistant:

extern void
add_format_to_iofile(FMContext fmc, FMFormat format, int id_size,
		     void *id_buffer, int index)
{
    int subformat_count = 0;
    int i, field;

    if (get_format_server_verbose()) {
	printf("Entering format %s (%p) into context %p ", 
	       format->format_name, format,
	       fmc);
	print_server_ID(id_buffer);
    }
    while (format->subformats && format->subformats[subformat_count]) {
	format->subformats[subformat_count]->subformats = format->subformats;
	subformat_count++;
    }
    if (id_size) {
	format->server_ID.length = id_size;
	format->server_ID.value = malloc(id_size);
	memcpy(format->server_ID.value, id_buffer, id_size);
    }

    fill_derived_format_values(fmc, format);
    for (i=0; i < subformat_count; i++) {
	fill_derived_format_values(fmc, format->subformats[i]);
    }	
    if (fmc->reg_format_count == fmc->format_list_size) {
	expand_FMContext(fmc);
    }
    if (index == -1) {
	index = fmc->reg_format_count++;
    } else {
 	if (fmc->format_list[index] != NULL) {
  	    free_FMformat(fmc->format_list[index]);
  	}
  	if (index > fmc->reg_format_count) {
  	    printf("Internal error. skipped format ids format %s.\n", 
		   format->format_name);
	    return;
  	}
  	if (index == fmc->reg_format_count) {
 	    /* new format came in */
  	    fmc->reg_format_count++;
  	}
    }
    fmc->format_list[index] = format;
    format->format_index = index;
    topo_order_subformats(format, subformat_count);
    /* bubble up the variant flags */
    for (i= 0; i < subformat_count; i++) {
	int j;
	for (j= 0; j < subformat_count; j++) {
	    FMFormat iof = format->subformats[j];
	    for (field = 0; field < iof->field_count; field++) {
		FMFormat subformat = iof->field_subformats[field];
		if (subformat != NULL) {
		    iof->variant |= subformat->variant;
		}
	    }
	}
    }
    for (field = 0; field < format->field_count; field++) {
	FMFormat subformat = format->field_subformats[field];
	if (subformat != NULL) {
	    format->variant |= subformat->variant;
	}
    }
}